

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

bool __thiscall
CorUnix::CSynchData::ReleaseFirstWaiter
          (CSynchData *this,CPalThread *pthrCurrent,bool *pfDelegated,bool fWorkerThread)

{
  ObjectDomain OVar1;
  uint uVar2;
  DWORD DVar3;
  ThreadWaitInfo *ptwiWaitInfo;
  CPalSynchronizationManager *this_00;
  bool bVar4;
  bool bVar5;
  WaitCompletionState WVar6;
  PAL_ERROR PVar7;
  WaitingThreadsListNode *pWVar8;
  DWORD *pWaitState;
  WaitingThreadsListNode *pwtlnNode;
  char *shridWLNode;
  CPalSynchronizationManager *shmptr;
  byte bVar9;
  CPalSynchronizationManager *this_01;
  
  this_00 = CPalSynchronizationManager::s_pObjSynchMgr;
  DVar3 = gPID;
  OVar1 = this->m_odObjectDomain;
  *pfDelegated = false;
  if (OVar1 == SharedObject) {
    this_01 = (CPalSynchronizationManager *)(this->m_ptrWTLHead).ptr;
    pWVar8 = (WaitingThreadsListNode *)SHMPtrToPtr((SHMPTR)this_01);
  }
  else {
    pWVar8 = (this->m_ptrWTLHead).ptr;
    this_01 = (CPalSynchronizationManager *)0x0;
  }
  bVar4 = false;
  shmptr = (CPalSynchronizationManager *)0x0;
LAB_002e1b9b:
  pwtlnNode = pWVar8;
  if (pwtlnNode == (WaitingThreadsListNode *)0x0) {
LAB_002e1e83:
    if (fWorkerThread) {
      CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(this);
    }
LAB_002e1e92:
    if (bVar4 != false) {
      CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
    }
    return pwtlnNode != (WaitingThreadsListNode *)0x0;
  }
  uVar2 = pwtlnNode->dwFlags;
  pWaitState = (DWORD *)SHMPtrToPtr(pwtlnNode->shridWaitingState);
  if (OVar1 != SharedObject) {
    pWVar8 = (pwtlnNode->ptrNext).ptr;
    if ((uVar2 & 2) == 0) goto LAB_002e1c81;
    if (pwtlnNode->dwProcessId != gPID) {
      fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x477);
      fprintf(_stderr,"Expression: fSharedObject || pwtlnItem->dwProcessId == gPID\n");
    }
    if ((!bVar4) && (pwtlnNode->ptwiWaitInfo->wdWaitDomain != LocalWait)) {
      CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
      bVar4 = true;
    }
LAB_002e1c63:
    if ((pwtlnNode->dwFlags & 4) == 0) {
      WVar6 = IsRestOfWaitAllSatisfied(this,pwtlnNode);
      if (WVar6 == WaitMayBeSatisfied) {
        if (OVar1 != SharedObject) {
          fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x51c);
          fprintf(_stderr,
                  "Expression: fSharedObject, Description: About to delegate object signaling to a remote process, but the signaled object is actually local\n"
                 );
        }
        PVar7 = CPalSynchronizationManager::DelegateSignalingToRemoteProcess
                          (pthrCurrent,pwtlnNode->dwProcessId,
                           (pwtlnNode->ptrOwnerObjSynchData).shrid);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e1eb6;
        if (PVar7 == 0) {
          *pfDelegated = true;
          goto LAB_002e1e92;
        }
      }
      else if (WVar6 == WaitIsSatisfied) goto LAB_002e1c81;
    }
LAB_002e1ca3:
    this_01 = shmptr;
    if (((fWorkerThread) && ((uVar2 & 2) != 0)) && (DVar3 == pwtlnNode->dwProcessId)) {
      CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress
                (pthrCurrent,pwtlnNode);
    }
    goto LAB_002e1b9b;
  }
  shmptr = (CPalSynchronizationManager *)(pwtlnNode->ptrNext).ptr;
  pWVar8 = (WaitingThreadsListNode *)SHMPtrToPtr((SHMPTR)shmptr);
  if ((uVar2 & 2) != 0) goto LAB_002e1c63;
LAB_002e1c81:
  if (PAL_InitializeChakraCoreCalled != false) {
    shridWLNode = (char *)0x0;
    bVar5 = CPalSynchronizationManager::InterlockedAwaken(pWaitState,false);
    if (!bVar5) goto LAB_002e1ca3;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e1eb6;
    if (DVar3 == pwtlnNode->dwProcessId) {
      DVar3 = pwtlnNode->dwObjIndex;
      ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;
      if (CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics ==
          OwnershipTracked) {
        bVar9 = this->m_fAbandoned;
        PVar7 = AssignOwnershipToThread(this,pthrCurrent,ptwiWaitInfo->pthrOwner);
        if ((PVar7 != 0) && (PAL_InitializeChakraCoreCalled == false)) goto LAB_002e1eb6;
      }
      else {
        bVar9 = 0;
      }
      if ((uVar2 & 2) != 0) {
        CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll
                  (pthrCurrent,ptwiWaitInfo->pthrOwner,pwtlnNode,this);
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002e1eb6;
      CPalSynchronizationManager::UnRegisterWait
                (this_00,pthrCurrent,ptwiWaitInfo,(bool)(OVar1 == SharedObject | bVar4));
      PVar7 = CPalSynchronizationManager::WakeUpLocalThread
                        (pthrCurrent,ptwiWaitInfo->pthrOwner,(uint)bVar9 * 2,DVar3);
    }
    else {
      if ((uVar2 & 2) != 0) {
        fprintf(_stderr,"] %s %s:%d","ReleaseFirstWaiter",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x4f2);
        shridWLNode = 
        "Expression: !fWaitAll, Description: Control should never reach this point if target wait is a wait-all\n"
        ;
        fprintf(_stderr,
                "Expression: !fWaitAll, Description: Control should never reach this point if target wait is a wait-all\n"
               );
      }
      PVar7 = CPalSynchronizationManager::WakeUpRemoteThread(this_01,(SHMPTR)shridWLNode);
    }
    if ((PVar7 == 0) || (PAL_InitializeChakraCoreCalled != false)) goto LAB_002e1e83;
  }
LAB_002e1eb6:
  abort();
}

Assistant:

bool CSynchData::ReleaseFirstWaiter(
        CPalThread * pthrCurrent,
        bool * pfDelegated,
        bool fWorkerThread)
    {        
        PAL_ERROR palErr = NO_ERROR;
        bool fSharedSynchLock = false;
        bool fSharedObject = (SharedObject == GetObjectDomain());
        bool fThreadAwakened = false;
        bool fDelegatedSignaling = false;
        DWORD * pdwWaitState;
        DWORD dwObjIdx;
        SharedID shridItem = NULLSharedID, shridNextItem = NULLSharedID;
        WaitingThreadsListNode * pwtlnItem, * pwtlnNextItem;
        DWORD dwPid = gPID;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        VALIDATEOBJECT(this);

        *pfDelegated = false;

        if (fSharedObject)
        {
            shridItem = GetWTLHeadShmPtr();
            pwtlnItem = SharedIDToTypePointer(WaitingThreadsListNode, shridItem);
        }
        else
        {
            pwtlnItem = GetWTLHeadPtr();
        }
            
        while (pwtlnItem)
        {
            VALIDATEOBJECT(pwtlnItem);
            
            WaitCompletionState wcsWaitCompletionState;
            bool fWaitAll = (0 != (WTLN_FLAG_WAIT_ALL & pwtlnItem->dwFlags));
            pdwWaitState = SharedIDToTypePointer(DWORD, 
                pwtlnItem->shridWaitingState);           

            if (fSharedObject)
            {
                shridNextItem = pwtlnItem->ptrNext.shrid;
                pwtlnNextItem = SharedIDToTypePointer(WaitingThreadsListNode, 
                                                  shridNextItem);
            }
            else
            {
                pwtlnNextItem = pwtlnItem->ptrNext.ptr;
            }                    

            if (fWaitAll)
            {
                // Wait All: we need to find out whether the wait is satisfied, 
                // or it is not, or if that cannot be determined from within 
                // this process (WaitMayBeSatisfied); in this case we need to 
                // delegate the object signaling to the process hosting the 
                // thread that owns the current target WaitingThreadsListNode

                // If the target object is local (fSharedObject == false)
                // we're probably not holding the shared lock.
                // If the wait is not a LocalWait, it involves at least one
                // shared object. If that is the case, at this time we need 
                // to grab the shared lock.  In fact IsRestOfWaitAllSatisfied
                // and UnsignalRestOfLocalAwakeningWaitAll must be called 
                // atomically to prevent that another thread living
                // in a different process could race with us stealing the 
                // signaling from one of the objects involved in the wait-all.
                //
                // Note: pwtlnItem->ptwiWaitInfo is valid only if the target
                // wait originates in the current process. Anyway in the 
                // following 'if' we don't need to check that since we are
                // already making sure that the object is local (!fSharedObject).
                // If a wait involves at least one object local to this process, 
                // it can only be a wait performed by a thread in the current 
                // process, therefore pwtlnItem->ptwiWaitInfo is valid.

                _ASSERTE(fSharedObject || pwtlnItem->dwProcessId == gPID); 
                
                if (!fSharedSynchLock && !fSharedObject && 
                    LocalWait != pwtlnItem->ptwiWaitInfo->wdWaitDomain)
                {
                    CPalSynchronizationManager::AcquireSharedSynchLock(pthrCurrent);
                    fSharedSynchLock = true;
                }   

                // First check if the current target node is already marked for 
                // wait all check in progress, and in case skip it by setting
                // wcsWaitCompletionState to WaitIsNotSatisfied
                bool fMarkedForDelegatedObjectSingalingInProgress = 
                    (0 != (WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS & pwtlnItem->dwFlags));
                
                wcsWaitCompletionState = 
                    fMarkedForDelegatedObjectSingalingInProgress ? WaitIsNotSatisfied : 
                    IsRestOfWaitAllSatisfied(pwtlnItem);
            }
            else
            {
                // Normal Wait: the wait is satisfied by definition
                wcsWaitCompletionState = WaitIsSatisfied;
            }
            
            if (WaitIsSatisfied == wcsWaitCompletionState)
            {
                //
                // Target wait is satisfied
                //
                TRACE("Trying to switch wait state [%p] from WAIT/ALERTABLE "
                      "to ACTIVE for thread=%u\n", 
                      pdwWaitState, pwtlnItem->dwThreadId);
                
                if (CPalSynchronizationManager::InterlockedAwaken(pdwWaitState, FALSE))
                {
                    TRACE("Succeeded switching wait state [%p] from WAIT/ALERTABLE "
                          "to TWS_ACTIVE for trhead=%u\n", 
                          pdwWaitState, pwtlnItem->dwThreadId);

                    dwObjIdx = pwtlnItem->dwObjIndex;
                    
                    if (dwPid == pwtlnItem->dwProcessId)
                    {
                        ///////////////////////////
                        //
                        // Local Thread Awakening
                        //
                        ///////////////////////////
                        ThreadWaitInfo * ptwiWaitInfo = pwtlnItem->ptwiWaitInfo;
                        bool fAbandoned = false;

                        if (CObjectType::OwnershipTracked ==
                            GetObjectType()->GetOwnershipSemantics())
                        {
                            // Get the abandoned status before resetting it by
                            // assigning ownership to target thread
                            fAbandoned = IsAbandoned();
                            
                            // Assign ownership to target thread
                            // Note: This will cause both ownership count and
                            //       signal count to be greater than zero at the
                            //       same time; the signal count will be anyway
                            //       decremented immediately by the caller 
                            //       CsynchData::Signal
                            palErr = AssignOwnershipToThread(pthrCurrent,
                                                             ptwiWaitInfo->pthrOwner);
                            if (NO_ERROR != palErr)
                            {
                                ERROR("Synch Worker: AssignOwnershipToThread "
                                      "failed with error %u; ownership data on "
                                      "object with SynchData %p may be "
                                      "corrupted\n", palErr, this);
                            }
                        }

                        if (fWaitAll)
                        {
                            // Wait all satisfied: unsignal other objects 
                            // involved in the wait
                            CPalSynchronizationManager::UnsignalRestOfLocalAwakeningWaitAll(
                                pthrCurrent,
                                ptwiWaitInfo->pthrOwner,
                                pwtlnItem,
                                this);
                        }                        

                        TRACE("Unregistering wait for thread %u and waking it up "
                              "[pdwWaitState=%p]\n", pwtlnItem->dwThreadId, 
                              pdwWaitState);
                        
                        // Unregister the wait
                        pSynchManager->UnRegisterWait(pthrCurrent, 
                                                      ptwiWaitInfo,
                                                      fSharedObject || fSharedSynchLock);

                        // After UnRegisterWait pwtlnItem is invalid
                        pwtlnItem = NULL; 
                                                
                        palErr = CPalSynchronizationManager::WakeUpLocalThread(
                            pthrCurrent, 
                            ptwiWaitInfo->pthrOwner, 
                            fAbandoned ? MutexAbondoned : WaitSucceeded,
                            dwObjIdx);
                        
                        if (NO_ERROR != palErr)
                        {
                            ERROR("Failed to wakeup local thread %#x: "
                                  "object signaling may be "
                                  "lost\n", ptwiWaitInfo->pthrOwner->GetThreadId());
                        }
                    }
                    else
                    {
                        ///////////////////////////
                        //
                        // Remote Thread Awakening
                        //
                        ///////////////////////////

                        // Note: if we are here, this cannot be a wait-all
                        _ASSERT_MSG(!fWaitAll, 
                                    "Control should never reach this point if "
                                    "target wait is a wait-all\n");

                        // Wake up remote thread
                        palErr = CPalSynchronizationManager::WakeUpRemoteThread(shridItem);

                        if (NO_ERROR != palErr)
                        {
                            ERROR("Failed to dispatch remote awakening cmd to "
                                  "worker thread in process pid=%d to wake up"
                                  "thread tid=%#x; object signaling may be "
                                  "lost\n", pwtlnItem->dwProcessId, 
                                  pwtlnItem->dwThreadId);
                        }
                    }

                    // A thread has been awakened
                    fThreadAwakened = true;

                    // break out of the while loop
                    break;
                }
            }
            else if (WaitMayBeSatisfied == wcsWaitCompletionState)
            {
                //////////////////////////////////////////
                //
                // Wait All with remote thread awakening
                //
                //////////////////////////////////////////
                
                //
                // We need to transfer the object signaling to the process
                // hosting the target waiter thread
                //                
                
                _ASSERT_MSG(fWaitAll,
                            "IsRestOfWaitAllSatisfied() apparently "
                            "returned -1 on a normal (non wait all) "
                            "wait\n");
                _ASSERT_MSG(fSharedObject,
                            "About to delegate object signaling to a remote "
                            "process, but the signaled object is actually "
                            "local\n");
                
                // Delegate object signaling to target process
                palErr = CPalSynchronizationManager::DelegateSignalingToRemoteProcess(
                    pthrCurrent,
                    pwtlnItem->dwProcessId,
                    pwtlnItem->ptrOwnerObjSynchData.shrid);

                TRACE("Delegating object signaling for SynchData shrid=%p\n",
                      (VOID *)pwtlnItem->ptrOwnerObjSynchData.shrid);
                
                if (NO_ERROR == palErr)
                {
                    // A remote thread will be awakened
                    // This will also cause the object to be unsignaled by the
                    // code calling ReleaseFirstWaiter before releasing the 
                    // synch locks, so no other WaitForMultipleObjects 
                    // involving the target object may race stealing this 
                    // particuklar object signaling 
                    fThreadAwakened = true;

                    fDelegatedSignaling = true;                    
                    
                    // break out of the while loop
                    break;
                }
                else
                {
                    ERROR("Failed to delegate object signaling to remote "
                          "process %d. Looking for another waiter.\n",
                          pwtlnItem->dwProcessId);

                    // Go on: a different target waiter will be selected
                }
            }

            if (fWorkerThread && fWaitAll && (dwPid == pwtlnItem->dwProcessId))
            {
                // Mark the target wait for object signaling
                CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress(
                    pthrCurrent,
                    pwtlnItem);
            }

            // Go to the next item
            shridItem = shridNextItem;
            pwtlnItem = pwtlnNextItem;
        }

        if (fDelegatedSignaling)
        {            
            *pfDelegated = true;
        }
        else if (fWorkerThread)
        {
            // Reset 'delegated object signaling in progress' flags
            CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(
                this);
        }

        if (fSharedSynchLock)
        {
            CPalSynchronizationManager::ReleaseSharedSynchLock(pthrCurrent);
        }
        return fThreadAwakened;   
    }